

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmCommonTargetGenerator::AddModuleDefinitionFlag
          (cmCommonTargetGenerator *this,cmLinkLineComputer *linkLineComputer,string *flags)

{
  cmMakefile *this_00;
  cmLocalCommonGenerator *pcVar1;
  ModuleDefinitionInfo *pMVar2;
  char *pcVar3;
  string flag;
  string sStack_88;
  string local_68;
  string local_48;
  
  pMVar2 = cmGeneratorTarget::GetModuleDefinitionInfo(this->GeneratorTarget,&this->ConfigName);
  if ((pMVar2 != (ModuleDefinitionInfo *)0x0) && ((pMVar2->DefFile)._M_string_length != 0)) {
    this_00 = this->Makefile;
    std::__cxx11::string::string
              ((string *)&sStack_88,"CMAKE_LINK_DEF_FILE_FLAG",(allocator *)&local_68);
    pcVar3 = cmMakefile::GetDefinition(this_00,&sStack_88);
    std::__cxx11::string::~string((string *)&sStack_88);
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::string((string *)&sStack_88,pcVar3,(allocator *)&local_68);
      pcVar1 = this->LocalCommonGenerator;
      (*linkLineComputer->_vptr_cmLinkLineComputer[2])(&local_48,linkLineComputer,pMVar2);
      cmOutputConverter::ConvertToOutputFormat
                (&local_68,&(pcVar1->super_cmLocalGenerator).super_cmOutputConverter,&local_48,SHELL
                );
      std::__cxx11::string::append((string *)&sStack_88);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
      (*(this->LocalCommonGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
                (this->LocalCommonGenerator,flags,&sStack_88);
      std::__cxx11::string::~string((string *)&sStack_88);
    }
  }
  return;
}

Assistant:

void cmCommonTargetGenerator::AddModuleDefinitionFlag(
  cmLinkLineComputer* linkLineComputer, std::string& flags)
{
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    this->GeneratorTarget->GetModuleDefinitionInfo(this->GetConfigName());
  if (!mdi || mdi->DefFile.empty()) {
    return;
  }

  // TODO: Create a per-language flag variable.
  const char* defFileFlag =
    this->Makefile->GetDefinition("CMAKE_LINK_DEF_FILE_FLAG");
  if (!defFileFlag) {
    return;
  }

  // Append the flag and value.  Use ConvertToLinkReference to help
  // vs6's "cl -link" pass it to the linker.
  std::string flag = defFileFlag;
  flag += this->LocalCommonGenerator->ConvertToOutputFormat(
    linkLineComputer->ConvertToLinkReference(mdi->DefFile),
    cmOutputConverter::SHELL);
  this->LocalCommonGenerator->AppendFlags(flags, flag);
}